

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O1

bool __thiscall
hwnet::TCPConnector::ConnectWithTimeout
          (TCPConnector *this,ConnectCallback *connectFn,size_t timeout,ErrorCallback *errorFn)

{
  _Atomic_word *p_Var1;
  bool bVar2;
  int iVar3;
  undefined1 local_48 [24];
  shared_ptr<hwnet::TCPConnector> self;
  
  bVar2 = Connect(this,connectFn,errorFn);
  if (timeout != 0 && bVar2) {
    std::__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<hwnet::TCPConnector,void>
              ((__shared_ptr<hwnet::TCPConnector,(__gnu_cxx::_Lock_policy)2> *)(local_48 + 0x10),
               (__weak_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<hwnet::TCPConnector>);
    util::TimerRoutine::
    addTimerOnce<void(&)(std::shared_ptr<hwnet::util::Timer>const&,std::shared_ptr<hwnet::TCPConnector>),std::shared_ptr<hwnet::TCPConnector>&>
              ((TimerRoutine *)local_48,(milliseconds)&this->poller_->timerRoutine,
               (_func_void_shared_ptr<hwnet::util::Timer>_ptr_shared_ptr<hwnet::TCPConnector> *)
               timeout,(shared_ptr<hwnet::TCPConnector> *)connectTimeout);
    std::__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->connectTimer).
                super___weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>,
               (__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)local_48);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)(local_48._8_8_ + 0xc);
        iVar3 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = *(_Atomic_word *)(local_48._8_8_ + 0xc);
        *(int *)(local_48._8_8_ + 0xc) = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*(*(_func_int ***)local_48._8_8_)[3])();
      }
    }
    if (self.super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 self.super___shared_ptr<hwnet::TCPConnector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  return bVar2;
}

Assistant:

bool TCPConnector::ConnectWithTimeout(const ConnectCallback &connectFn,size_t timeout,const ErrorCallback &errorFn) {
	bool ret = Connect(connectFn,errorFn);
	if(ret && timeout > 0) {
		auto self = shared_from_this();
		this->connectTimer = poller_->addTimerOnce(timeout,TCPConnector::connectTimeout,self);
	}
	return ret;
}